

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O0

void * mpp_buffer_get_ptr_with_caller(MppBuffer buffer,char *caller)

{
  MppBufferImpl *p;
  char *caller_local;
  MppBuffer buffer_local;
  
  if (buffer == (MppBuffer)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr invalid NULL input from %s\n",(char *)0x0,caller);
    buffer_local = (MppBuffer)0x0;
  }
  else {
    if (*(long *)((long)buffer + 0x90) == 0) {
      mpp_buffer_mmap((MppBufferImpl *)buffer,caller);
    }
    if ((*(long *)((long)buffer + 0x90) == 0) &&
       (_mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "p->info.ptr != __null","mpp_buffer_get_ptr_with_caller",0xb2),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (*(long *)((long)buffer + 0x90) == 0) {
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_ptr buffer %p ret NULL from %s\n",(char *)0x0,buffer
                 ,caller);
    }
    buffer_local = *(MppBuffer *)((long)buffer + 0x90);
  }
  return buffer_local;
}

Assistant:

void *mpp_buffer_get_ptr_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_ptr invalid NULL input from %s\n", caller);
        return NULL;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    if (NULL == p->info.ptr)
        mpp_buffer_mmap(p, caller);

    mpp_assert(p->info.ptr != NULL);
    if (NULL == p->info.ptr)
        mpp_err("mpp_buffer_get_ptr buffer %p ret NULL from %s\n", buffer, caller);

    return p->info.ptr;
}